

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestCallHandler::encode
          (TestCallHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  StructBuilder SStack_98;
  Builder params;
  Builder call;
  
  capnp::json::Value::Builder::initCall(&call,&output);
  value.super_StringPtr.content.size_ = 5;
  value.super_StringPtr.content.ptr = "Frob";
  capnp::json::Value::Call::Builder::setFunction(&call,value);
  capnp::json::Value::Call::Builder::initParams((Builder *)&params.builder,&call,2);
  ListBuilder::getStructElement(&SStack_98,&params.builder,0);
  *(undefined2 *)SStack_98.data = 2;
  *(undefined8 *)((long)SStack_98.data + 8) = 0x405ec00000000000;
  ListBuilder::getStructElement(&SStack_98,&params.builder,1);
  capnp::json::Value::Builder::setString((Builder *)&SStack_98,input);
  return;
}

Assistant:

void encode(const JsonCodec& codec, Text::Reader input,
              JsonValue::Builder output) const override {
    auto call = output.initCall();
    call.setFunction("Frob");
    auto params = call.initParams(2);
    params[0].setNumber(123);
    params[1].setString(input);
  }